

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall InterpreterTestSuite::TestContext::TestContext(TestContext *this)

{
  FunctionMocker<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_00;
  CommissionerAppMock *this_01;
  
  ot::commissioner::Interpreter::Interpreter(&this->mInterpreter);
  this->mRegistry = (Registry *)0x0;
  this_01 = (CommissionerAppMock *)operator_new(0x1838);
  memset(this_01,0,0x1838);
  CommissionerAppMock::CommissionerAppMock(this_01);
  (this->mDefaultCommissionerObject).
  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
            (&(this->mDefaultCommissionerObject).
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             this_01);
  (this->mCommissionerAppStaticExpecter)._vptr_CommissionerAppStaticExpecter =
       (_func_int **)&PTR__CommissionerAppStaticExpecter_00395b78;
  this_00 = &(this->mCommissionerAppStaticExpecter).gmock02_Create_150;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&this_00->super_UntypedFunctionMockerBase);
  (this_00->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00395ba8;
  SetCommissionerAppStaticExpecter(&this->mCommissionerAppStaticExpecter);
  return;
}

Assistant:

TestContext() { SetCommissionerAppStaticExpecter(&mCommissionerAppStaticExpecter); }